

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall
Js::PolymorphicCacheUtilizationArray::SetUtil
          (PolymorphicCacheUtilizationArray *this,FunctionBody *functionBody,uint index,byte util)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  
  if (functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1fe0,"(functionBody)","functionBody");
    if (!bVar2) goto LAB_0077cfa5;
    *puVar4 = 0;
  }
  uVar3 = FunctionBody::GetCountField(functionBody,InlineCacheCount);
  if (uVar3 <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1fe1,"(index < functionBody->GetInlineCacheCount())",
                                "index < functionBody->GetInlineCacheCount()");
    if (!bVar2) {
LAB_0077cfa5:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  EnsureUtilArray(this,((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.
                       m_scriptContext)->recycler,functionBody);
  (this->utilArray).ptr[index] = util;
  return;
}

Assistant:

void PolymorphicCacheUtilizationArray::SetUtil(Js::FunctionBody* functionBody, uint index, byte util)
    {
        Assert(functionBody);
        Assert(index < functionBody->GetInlineCacheCount());

        EnsureUtilArray(functionBody->GetScriptContext()->GetRecycler(), functionBody);
        this->utilArray[index] = util;
    }